

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O2

void MurmurHash3_x86_128(void *key,int len,uint32_t seed,void *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int *piVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  lVar10 = (long)(len / 0x10);
  lVar5 = (long)(len / 0x10 << 4);
  auVar14 = vpbroadcastd_avx512vl();
  piVar12 = (int *)(lVar5 + lVar10 * -0x10 + (long)key);
  auVar1 = vpmovsxbd_avx(ZEXT416(0xf10));
  auVar2 = vpmovsxbd_avx(ZEXT416(0xf11));
  auVar17._8_4_ = 5;
  auVar17._0_8_ = 0x500000005;
  auVar17._12_4_ = 5;
  uVar4 = seed;
  while( true ) {
    uVar16 = auVar14._0_8_;
    uVar6 = auVar14._0_4_;
    bVar13 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    if (bVar13) break;
    uVar7 = ((uint)(*piVar12 * 0x239b961b) >> 0x11 | *piVar12 * -0x34f28000) * -0x54f16877 ^ uVar4;
    iVar3 = (uVar7 >> 0xd | uVar7 << 0x13) + uVar6;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(piVar12 + 1);
    auVar15 = vpmulld_avx(auVar18,ZEXT816(0x38b34ae5ab0e9789));
    auVar18 = vpmulld_avx(auVar18,ZEXT816(0x95ca000097890000));
    auVar15 = vpsrlvd_avx2(auVar15,auVar1);
    auVar15 = vpor_avx(auVar15,auVar18);
    auVar15 = vpmulld_avx(auVar15,ZEXT816(0xa1e38b9338b34ae5));
    auVar15 = vprolvd_avx512vl(auVar15 ^ auVar14,auVar2);
    auVar14 = vpsrlq_avx(auVar14,0x20);
    auVar14 = vpinsrd_avx(auVar14,seed,1);
    auVar14 = vpaddd_avx(auVar15,auVar14);
    auVar14 = vpmulld_avx(auVar14,auVar17);
    uVar4 = iVar3 * 5 + 0x561ccd1b;
    auVar14 = vpaddd_avx(auVar14,ZEXT816(0x96cd1c350bcaa747));
    uVar6 = ((uint)(piVar12[3] * -0x5e1c746d) >> 0xe | piVar12[3] * 0x2e4c0000) * 0x239b961b ^ seed;
    seed = ((uVar6 >> 0x13 | uVar6 << 0xd) + iVar3 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
    piVar12 = piVar12 + 4;
  }
  uVar8 = auVar14._4_4_;
  uVar7 = 0;
  uVar11 = 0;
  switch(len & 0xf) {
  case 0xf:
    uVar11 = (uint)*(byte *)((long)key + lVar5 + 0xe) << 0x10;
  case 0xe:
    uVar11 = uVar11 | (uint)*(byte *)((long)key + lVar5 + 0xd) << 8;
  case 0xd:
    uVar11 = *(byte *)((long)key + lVar5 + 0xc) ^ uVar11;
    seed = seed ^ (uVar11 * -0x5e1c746d >> 0xe | uVar11 * 0x2e4c0000) * 0x239b961b;
  case 0xc:
    uVar11 = (uint)*(byte *)((long)key + lVar5 + 0xb) << 0x18;
  case 0xb:
    uVar11 = uVar11 | (uint)*(byte *)((long)key + lVar5 + 10) << 0x10;
  case 10:
    uVar11 = uVar11 ^ (uint)*(byte *)((long)key + lVar5 + 9) << 8;
  case 9:
    uVar11 = *(byte *)((long)key + lVar5 + 8) ^ uVar11;
    uVar8 = uVar8 ^ (uVar11 * 0x38b34ae5 >> 0xf | uVar11 * -0x6a360000) * -0x5e1c746d;
  case 8:
    uVar11 = (uint)*(byte *)((long)key + lVar5 + 7) << 0x18;
  case 7:
    uVar11 = uVar11 | (uint)*(byte *)((long)key + lVar5 + 6) << 0x10;
  case 6:
    uVar11 = uVar11 ^ (uint)*(byte *)((long)key + lVar5 + 5) << 8;
  case 5:
    uVar11 = *(byte *)((long)key + lVar5 + 4) ^ uVar11;
    auVar14 = vpinsrd_avx(ZEXT416((uVar11 * -0x54f16877 >> 0x10 | uVar11 * -0x68770000) * 0x38b34ae5
                                  ^ uVar6),uVar8,1);
    uVar16 = auVar14._0_8_;
  case 4:
    uVar11 = (uint)*(byte *)((long)key + lVar5 + 3) << 0x18;
  case 3:
    uVar7 = uVar11 | (uint)*(byte *)((long)key + lVar5 + 2) << 0x10;
  case 2:
    uVar7 = uVar7 ^ (uint)*(byte *)((long)key + lVar5 + 1) << 8;
  case 1:
    uVar7 = *(byte *)((long)key + lVar5) ^ uVar7;
    uVar4 = uVar4 ^ (uVar7 * 0x239b961b >> 0x11 | uVar7 * -0x34f28000) * -0x54f16877;
    uVar6 = (uint)uVar16;
    uVar8 = (uint)((ulong)uVar16 >> 0x20);
  case 0:
    uVar7 = (seed ^ len) + (uVar6 ^ len) + (uVar8 ^ len) + (uVar4 ^ len);
    uVar11 = (uVar6 ^ len) + uVar7;
    uVar9 = (uVar8 ^ len) + uVar7;
    uVar8 = (seed ^ len) + uVar7;
    uVar6 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
    uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
    uVar7 = (uVar11 >> 0x10 ^ uVar11) * -0x7a143595;
    uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
    uVar7 = uVar7 >> 0x10 ^ uVar7;
    uVar11 = (uVar9 >> 0x10 ^ uVar9) * -0x7a143595;
    uVar11 = (uVar11 >> 0xd ^ uVar11) * -0x3d4d51cb;
    uVar11 = uVar11 >> 0x10 ^ uVar11;
    uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
    uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
    iVar3 = (uVar6 >> 0x10 ^ uVar6) + uVar7 + uVar11 + uVar8;
    *(int *)out = iVar3;
    *(uint *)((long)out + 4) = uVar7 + iVar3;
    *(uint *)((long)out + 8) = uVar11 + iVar3;
    *(uint *)((long)out + 0xc) = uVar8 + iVar3;
    return;
  }
}

Assistant:

void MurmurHash3_x86_128(const void* key, const int len,
	uint32_t seed, void* out)
{
	const uint8_t* data = (const uint8_t*)key;
	const int nblocks = len / 16;

	uint32_t h1 = seed;
	uint32_t h2 = seed;
	uint32_t h3 = seed;
	uint32_t h4 = seed;

	const uint32_t c1 = 0x239b961b;
	const uint32_t c2 = 0xab0e9789;
	const uint32_t c3 = 0x38b34ae5;
	const uint32_t c4 = 0xa1e38b93;
	const uint32_t* blocks = (const uint32_t*)(data + nblocks * 16);

	for (int i = -nblocks; i; i++)
	{
		uint32_t k1 = getblock32(blocks, i * 4 + 0);
		uint32_t k2 = getblock32(blocks, i * 4 + 1);
		uint32_t k3 = getblock32(blocks, i * 4 + 2);
		uint32_t k4 = getblock32(blocks, i * 4 + 3);

		k1 *= c1; k1 = ROTL32(k1, 15); k1 *= c2; h1 ^= k1;
		h1 = ROTL32(h1, 19); h1 += h2; h1 = h1 * 5 + 0x561ccd1b;
		k2 *= c2; k2 = ROTL32(k2, 16); k2 *= c3; h2 ^= k2;
		h2 = ROTL32(h2, 17); h2 += h3; h2 = h2 * 5 + 0x0bcaa747;
		k3 *= c3; k3 = ROTL32(k3, 17); k3 *= c4; h3 ^= k3;
		h3 = ROTL32(h3, 15); h3 += h4; h3 = h3 * 5 + 0x96cd1c35;
		k4 *= c4; k4 = ROTL32(k4, 18); k4 *= c1; h4 ^= k4;
		h4 = ROTL32(h4, 13); h4 += h1; h4 = h4 * 5 + 0x32ac3b17;
	}

	const uint8_t* tail = (const uint8_t*)(data + nblocks * 16);

	uint32_t k1 = 0;
	uint32_t k2 = 0;
	uint32_t k3 = 0;
	uint32_t k4 = 0;

	switch (len & 15)
	{
	case 15: k4 ^= tail[14] << 16;
	case 14: k4 ^= tail[13] << 8;
	case 13: k4 ^= tail[12] << 0;
		k4 *= c4; k4 = ROTL32(k4, 18); k4 *= c1; h4 ^= k4;

	case 12: k3 ^= tail[11] << 24;
	case 11: k3 ^= tail[10] << 16;
	case 10: k3 ^= tail[9] << 8;
	case  9: k3 ^= tail[8] << 0;
		k3 *= c3; k3 = ROTL32(k3, 17); k3 *= c4; h3 ^= k3;

	case  8: k2 ^= tail[7] << 24;
	case  7: k2 ^= tail[6] << 16;
	case  6: k2 ^= tail[5] << 8;
	case  5: k2 ^= tail[4] << 0;
		k2 *= c2; k2 = ROTL32(k2, 16); k2 *= c3; h2 ^= k2;

	case  4: k1 ^= tail[3] << 24;
	case  3: k1 ^= tail[2] << 16;
	case  2: k1 ^= tail[1] << 8;
	case  1: k1 ^= tail[0] << 0;
		k1 *= c1; k1 = ROTL32(k1, 15); k1 *= c2; h1 ^= k1;
	};

	h1 ^= len; h2 ^= len; h3 ^= len; h4 ^= len;

	h1 += h2; h1 += h3; h1 += h4;
	h2 += h1; h3 += h1; h4 += h1;

	h1 = fmix32(h1);
	h2 = fmix32(h2);
	h3 = fmix32(h3);
	h4 = fmix32(h4);

	h1 += h2; h1 += h3; h1 += h4;
	h2 += h1; h3 += h1; h4 += h1;

	((uint32_t*)out)[0] = h1;
	((uint32_t*)out)[1] = h2;
	((uint32_t*)out)[2] = h3;
	((uint32_t*)out)[3] = h4;
}